

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O0

Abc_ManRef_t * Abc_NtkManRefStart(int nNodeSizeMax,int nConeSizeMax,int fUseDcs,int fVerbose)

{
  int nVars;
  Abc_ManRef_t *__s;
  Vec_Str_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Abc_ManRef_t *p;
  int fVerbose_local;
  int fUseDcs_local;
  int nConeSizeMax_local;
  int nNodeSizeMax_local;
  
  __s = (Abc_ManRef_t *)malloc(0xa8);
  memset(__s,0,0xa8);
  pVVar1 = Vec_StrAlloc(100);
  __s->vCube = pVVar1;
  pVVar2 = Vec_PtrAlloc(100);
  __s->vVisited = pVVar2;
  __s->nNodeSizeMax = nNodeSizeMax;
  __s->nConeSizeMax = nConeSizeMax;
  __s->fVerbose = fVerbose;
  nVars = Abc_MaxInt(nNodeSizeMax,6);
  pVVar2 = Vec_PtrAllocTruthTables(nVars);
  __s->vVars = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  __s->vFuncs = pVVar2;
  pVVar3 = Vec_IntAlloc(0x10000);
  __s->vMemory = pVVar3;
  return __s;
}

Assistant:

Abc_ManRef_t * Abc_NtkManRefStart( int nNodeSizeMax, int nConeSizeMax, int fUseDcs, int fVerbose )
{
    Abc_ManRef_t * p;
    p = ABC_ALLOC( Abc_ManRef_t, 1 );
    memset( p, 0, sizeof(Abc_ManRef_t) );
    p->vCube        = Vec_StrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->fVerbose     = fVerbose;
    p->vVars        = Vec_PtrAllocTruthTables( Abc_MaxInt(nNodeSizeMax, 6) );
    p->vFuncs       = Vec_PtrAlloc( 100 );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    return p;
}